

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Vec_Ptr_t * Saig_ManWindowCollectPos(Aig_Man_t *p,Vec_Ptr_t *vNodes,Vec_Ptr_t **pvPointers)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *Entry;
  int local_3c;
  int i;
  Aig_Obj_t *pPointer;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodesPo;
  Vec_Ptr_t **pvPointers_local;
  Vec_Ptr_t *vNodes_local;
  Aig_Man_t *p_local;
  
  p_00 = Vec_PtrAlloc(1000);
  if (pvPointers != (Vec_Ptr_t **)0x0) {
    pVVar2 = Vec_PtrAlloc(1000);
    *pvPointers = pVVar2;
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(vNodes), local_3c < iVar1; local_3c = local_3c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vNodes,local_3c);
    Entry = Saig_ObjHasUnlabeledFanout(p,pObj_00);
    if ((Entry != (Aig_Obj_t *)0x0) && (Vec_PtrPush(p_00,pObj_00), pvPointers != (Vec_Ptr_t **)0x0))
    {
      Vec_PtrPush(*pvPointers,Entry);
    }
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Saig_ManWindowCollectPos( Aig_Man_t * p, Vec_Ptr_t * vNodes, Vec_Ptr_t ** pvPointers )
{
    Vec_Ptr_t * vNodesPo;
    Aig_Obj_t * pObj, * pPointer;
    int i;
    vNodesPo = Vec_PtrAlloc( 1000 );
    if ( pvPointers )
        *pvPointers = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        if ( (pPointer = Saig_ObjHasUnlabeledFanout(p, pObj)) )
        {
            Vec_PtrPush( vNodesPo, pObj );
            if ( pvPointers )
                Vec_PtrPush( *pvPointers, pPointer );
        }
    }
    return vNodesPo;
}